

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O2

void __thiscall
TPZFYsmpMatrix<double>::AddKelOld
          (TPZFYsmpMatrix<double> *this,TPZFMatrix<double> *elmat,TPZVec<int> *destinationindex)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long *plVar3;
  long lVar4;
  double *pdVar5;
  const_iterator __pos;
  ostream *poVar6;
  _Base_ptr p_Var7;
  double *pdVar8;
  _Self __tmp;
  long *plVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> mapindex;
  long local_b8;
  long *local_a8;
  _Rb_tree_node_base *local_a0;
  pair<long,_long> local_70;
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_60;
  
  lVar2 = destinationindex->fNElements;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar12 = 0;
  lVar11 = 0;
  if (0 < lVar2) {
    lVar11 = lVar2;
  }
  __pos._M_node = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; lVar11 != lVar12; lVar12 = lVar12 + 1) {
    local_70.first = (long)destinationindex->fStore[lVar12];
    local_70.second = lVar12;
    __pos._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
         ::_M_emplace_hint_equal<std::pair<long,long>>
                   ((_Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
                     *)&local_60,__pos,&local_70);
  }
  lVar12 = 0;
  do {
    if (lVar12 == lVar11) {
      std::
      _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    plVar9 = (this->fIA).fStore;
    plVar3 = (this->fJA).fStore;
    lVar10 = plVar9[destinationindex->fStore[lVar12]];
    local_a8 = plVar3 + lVar10;
    plVar3 = plVar3 + plVar9[(long)destinationindex->fStore[lVar12] + 1];
    local_a0 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b8 = 0;
LAB_00dc4831:
LAB_00dc4851:
    if (local_a8 != plVar3 && local_b8 < lVar2) {
      lVar4 = *local_a8;
      if (lVar4 == *(long *)(local_a0 + 1)) {
        p_Var7 = local_a0[1]._M_parent;
        pdVar8 = TPZFMatrix<double>::operator()(elmat,lVar12,(int64_t)p_Var7);
        pdVar5 = (this->fA).fStore;
        pdVar5[lVar10] = *pdVar8 + pdVar5[lVar10];
        local_a0 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_a0);
        if (((_Rb_tree_header *)local_a0 != p_Var1) && (local_a0[1]._M_parent != p_Var7)) {
          local_a8 = local_a8 + 1;
          lVar10 = lVar10 + 1;
        }
        local_b8 = local_b8 + 1;
        goto LAB_00dc4831;
      }
      if (*(long *)(local_a0 + 1) <= lVar4) {
        if ((long)local_a0[1]._M_parent < lVar4) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "virtual void TPZFYsmpMatrix<double>::AddKelOld(TPZFMatrix<TVar> &, TPZVec<int> &) [TVar = double]"
                                  );
          std::operator<<(poVar6," inconsistent\n");
          for (plVar9 = (this->fJA).fStore + lVar10; plVar9 < plVar3; plVar9 = plVar9 + 1) {
            poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
            std::operator<<(poVar6," ");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != p_Var1;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
            poVar6 = std::operator<<(poVar6,"/");
            poVar6 = std::ostream::_M_insert<long>((long)poVar6);
            std::operator<<(poVar6," ");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        goto LAB_00dc4851;
      }
      local_a8 = local_a8 + 1;
      lVar10 = lVar10 + 1;
      goto LAB_00dc4831;
    }
    if (local_b8 != lVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "virtual void TPZFYsmpMatrix<double>::AddKelOld(TPZFMatrix<TVar> &, TPZVec<int> &) [TVar = double]"
                              );
      poVar6 = std::operator<<(poVar6," inconsistent2 j = ");
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      poVar6 = std::operator<<(poVar6," nel ");
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::operator<<(poVar6,"\n");
      for (plVar9 = (this->fJA).fStore + lVar10; plVar9 < plVar3; plVar9 = plVar9 + 1) {
        poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
        std::operator<<(poVar6," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7))
      {
        poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
        poVar6 = std::operator<<(poVar6,"/");
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::operator<<(poVar6," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKelOld(TPZFMatrix<TVar> & elmat, TPZVec < int > & destinationindex){
	int64_t i=0;
	int64_t j=0;
	int64_t ilocal=0;
	//  int jlocal=0;
	int64_t nel = destinationindex.NElements();
	std::multimap<int64_t,int64_t> mapindex;
	std::multimap<int64_t,int64_t>::iterator hint = mapindex.begin();
	for(i=0;i<nel;i++){
		ilocal = destinationindex[i];
		hint = mapindex.insert(hint,std::make_pair(ilocal,i));
		//    mapindex[ilocal] = i;
	}
	for(i=0;i<nel;i++){
		ilocal = destinationindex[i];
		int64_t jfirst = fIA[ilocal];
		int64_t jlast = fIA[ilocal+1];
		int64_t *Aptr = &fJA[jfirst];
		int64_t *AptrLast = &fJA[jlast];
		j=0;
		std::multimap<int64_t,int64_t>::iterator itelmat = mapindex.begin();
		while(j<nel && Aptr != AptrLast)
		{
			if(*Aptr == (*itelmat).first)
			{
				int64_t jel = (*itelmat).second;
				fA[jfirst] += elmat(i,jel);
				itelmat++;
				if(itelmat != mapindex.end() && (*itelmat).second != jel)
				{
					Aptr++;
					jfirst++;
				}
				j++;
			}
			else if(*Aptr < (*itelmat).first)
			{
				Aptr++;
				jfirst++;
			}
			else if(*Aptr > (*itelmat).second)
			{
				std::cout << __PRETTY_FUNCTION__ << " inconsistent\n";
				int64_t *iptr = &fJA[jfirst];
				while(iptr < AptrLast) 
				{
					cout << *iptr << " ";
					iptr++;
				}
				cout << endl;
				std::multimap<int64_t,int64_t>::iterator itelmat2 = mapindex.begin();
				for(;itelmat2 != mapindex.end(); itelmat2++)
				{
					cout << (*itelmat2).first << "/" << (*itelmat2).second << " ";
				}
				cout << endl;
				
			}
		}
		if(j!= nel)
		{
			std::cout << __PRETTY_FUNCTION__ << " inconsistent2 j = " << j << " nel " << nel << "\n";
			int64_t *iptr = &fJA[jfirst];
			while(iptr < AptrLast) 
			{
				cout << *iptr << " ";
				iptr++;
			}
			cout << endl;
			std::multimap<int64_t,int64_t>::iterator itelmat2 = mapindex.begin();
			for(;itelmat2 != mapindex.end(); itelmat2++)
			{
				cout << (*itelmat2).first << "/" << (*itelmat2).second << " ";
			}
			cout << endl;
		}
	}
	
}